

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

void absl::cord_internal::anon_unknown_0::DumpAll
               (CordRep *rep,bool include_contents,ostream *stream,size_t depth)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_type __n;
  ostream *poVar4;
  iterator ppCVar5;
  CordRepSubstring *pCVar6;
  CordRepFlat *this;
  AlphaNum *in_R8;
  CordRepSubstring *substring;
  CordRep *edge;
  iterator __end3;
  iterator __begin3;
  Span<absl::cord_internal::CordRep_*const> *local_290;
  Span<absl::cord_internal::CordRep_*const> *__range3;
  AlphaNum local_280;
  AlphaNum local_250;
  AlphaNum local_220;
  undefined1 local_1f0 [8];
  string label;
  CordRepBtree *node;
  string local_1c0 [32];
  undefined1 local_1a0 [8];
  anon_class_16_2_6856332a maybe_dump_data;
  Hex local_170;
  AlphaNum local_160;
  AlphaNum local_130;
  undefined1 local_100 [8];
  string sptr;
  AlphaNum local_b0;
  AlphaNum local_80;
  byte local_4a;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string sharing;
  size_t depth_local;
  ostream *stream_local;
  bool include_contents_local;
  CordRep *rep_local;
  
  sharing.field_2._8_8_ = depth;
  if (0xe < depth) {
    __assert_fail("depth <= CordRepBtree::kMaxDepth + 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x40,
                  "void absl::cord_internal::(anonymous namespace)::DumpAll(const CordRep *, bool, std::ostream &, size_t)"
                 );
  }
  bVar1 = RefcountAndFlags::IsOne(&rep->refcount);
  local_4a = 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_4a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"Private",&local_49);
  }
  else {
    AlphaNum::AlphaNum(&local_80,"Shared(");
    sVar3 = RefcountAndFlags::Get(&rep->refcount);
    AlphaNum::AlphaNum(&local_b0,sVar3);
    AlphaNum::AlphaNum((AlphaNum *)((long)&sptr.field_2 + 8),")");
    depth = (long)&sptr.field_2 + 8;
    StrCat_abi_cxx11_((string *)local_48,(absl *)&local_80,&local_b0,(AlphaNum *)depth,in_R8);
  }
  if ((local_4a & 1) != 0) {
    std::allocator<char>::~allocator(&local_49);
  }
  AlphaNum::AlphaNum(&local_130,"0x");
  Hex::Hex<absl::cord_internal::CordRep_const>(&local_170,rep,kNoPad);
  memset(&maybe_dump_data.include_contents,0,0x20);
  strings_internal::StringifySink::StringifySink((StringifySink *)&maybe_dump_data.include_contents)
  ;
  AlphaNum::AlphaNum<absl::Hex,void>
            (&local_160,&local_170,(StringifySink *)&maybe_dump_data.include_contents);
  StrCat_abi_cxx11_((string *)local_100,(absl *)&local_130,&local_160,(AlphaNum *)depth);
  strings_internal::StringifySink::~StringifySink
            ((StringifySink *)&maybe_dump_data.include_contents);
  __n = sharing.field_2._8_8_ << 1;
  local_1a0 = (undefined1  [8])stream;
  maybe_dump_data.stream._0_1_ = include_contents;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c0,__n,' ',(allocator<char> *)((long)&node + 7));
  poVar4 = std::operator<<(stream,local_1c0);
  poVar4 = std::operator<<(poVar4,(string *)local_48);
  poVar4 = std::operator<<(poVar4," (");
  poVar4 = std::operator<<(poVar4,(string *)local_100);
  std::operator<<(poVar4,") ");
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&node + 7));
  bVar1 = CordRep::IsBtree(rep);
  if (bVar1) {
    label.field_2._8_8_ = CordRep::btree(rep);
    iVar2 = CordRepBtree::height((CordRepBtree *)label.field_2._8_8_);
    __range3._6_1_ = 0;
    if (iVar2 == 0) {
      std::allocator<char>::allocator();
      __range3._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1f0,"Leaf",(allocator<char> *)((long)&__range3 + 7));
    }
    else {
      AlphaNum::AlphaNum(&local_220,"Node(");
      iVar2 = CordRepBtree::height((CordRepBtree *)label.field_2._8_8_);
      AlphaNum::AlphaNum(&local_250,iVar2);
      AlphaNum::AlphaNum(&local_280,")");
      StrCat_abi_cxx11_((string *)local_1f0,(absl *)&local_220,&local_250,&local_280,in_R8);
    }
    if ((__range3._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    }
    poVar4 = std::operator<<(stream,(string *)local_1f0);
    poVar4 = std::operator<<(poVar4,", len = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(ulong *)label.field_2._8_8_);
    poVar4 = std::operator<<(poVar4,", begin = ");
    sVar3 = CordRepBtree::begin((CordRepBtree *)label.field_2._8_8_);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
    poVar4 = std::operator<<(poVar4,", end = ");
    sVar3 = CordRepBtree::end((CordRepBtree *)label.field_2._8_8_);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
    std::operator<<(poVar4,"\n");
    ___begin3 = CordRepBtree::Edges((CordRepBtree *)label.field_2._8_8_);
    local_290 = (Span<absl::cord_internal::CordRep_*const> *)&__begin3;
    __end3 = Span<absl::cord_internal::CordRep_*const>::begin(local_290);
    ppCVar5 = Span<absl::cord_internal::CordRep_*const>::end(local_290);
    for (; __end3 != ppCVar5; __end3 = __end3 + 1) {
      DumpAll(*__end3,include_contents,stream,sharing.field_2._8_8_ + 1);
    }
    std::__cxx11::string::~string((string *)local_1f0);
  }
  else if (rep->tag == '\x01') {
    pCVar6 = CordRep::substring(rep);
    poVar4 = std::operator<<(stream,"Substring, len = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,rep->length);
    poVar4 = std::operator<<(poVar4,", start = ");
    std::ostream::operator<<(poVar4,pCVar6->start);
    DumpAll::anon_class_16_2_6856332a::operator()((anon_class_16_2_6856332a *)local_1a0,rep);
    DumpAll(pCVar6->child,include_contents,stream,sharing.field_2._8_8_ + 1);
  }
  else if (rep->tag < 6) {
    if (rep->tag == '\x05') {
      poVar4 = std::operator<<(stream,"Extn, len = ");
      std::ostream::operator<<(poVar4,rep->length);
      DumpAll::anon_class_16_2_6856332a::operator()((anon_class_16_2_6856332a *)local_1a0,rep);
    }
  }
  else {
    poVar4 = std::operator<<(stream,"Flat, len = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,rep->length);
    poVar4 = std::operator<<(poVar4,", cap = ");
    this = CordRep::flat(rep);
    sVar3 = CordRepFlat::Capacity(this);
    std::ostream::operator<<(poVar4,sVar3);
    DumpAll::anon_class_16_2_6856332a::operator()((anon_class_16_2_6856332a *)local_1a0,rep);
  }
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void DumpAll(const CordRep* rep,
             bool include_contents,
             std::ostream& stream,
             size_t depth = 0) {
  // Allow for full height trees + substring -> flat / external nodes.
  assert(depth <= CordRepBtree::kMaxDepth + 2);
  std::string sharing = const_cast<CordRep*>(rep)->refcount.IsOne()
                            ? std::string("Private")
                            : absl::StrCat("Shared(", rep->refcount.Get(), ")");
  std::string sptr = absl::StrCat("0x", absl::Hex(rep));

  // Dumps the data contents of `rep` if `include_contents` is true.
  // Always emits a new line character.
  auto maybe_dump_data = [&stream, include_contents](const CordRep* r) {
    if (include_contents) {
      // Allow for up to 60 wide display of content data, which with some
      // indentation and prefix / labels keeps us within roughly 80-100 wide.
      constexpr size_t kMaxDataLength = 60;
      stream << ", data = \""
             << EdgeData(r).substr(0, kMaxDataLength)
             << (r->length > kMaxDataLength ? "\"..." : "\"");
    }
    stream << '\n';
  };

  // For each level, we print the 'shared/private' state and the rep pointer,
  // indented by two spaces per recursive depth.
  stream << std::string(depth * 2, ' ') << sharing << " (" << sptr << ") ";

  if (rep->IsBtree()) {
    const CordRepBtree* node = rep->btree();
    std::string label =
        node->height() ? absl::StrCat("Node(", node->height(), ")") : "Leaf";
    stream << label << ", len = " << node->length
           << ", begin = " << node->begin() << ", end = " << node->end()
           << "\n";
    for (CordRep* edge : node->Edges()) {
      DumpAll(edge, include_contents, stream, depth + 1);
    }
  } else if (rep->tag == SUBSTRING) {
    const CordRepSubstring* substring = rep->substring();
    stream << "Substring, len = " << rep->length
           << ", start = " << substring->start;
    maybe_dump_data(rep);
    DumpAll(substring->child, include_contents, stream, depth + 1);
  } else if (rep->tag >= FLAT) {
    stream << "Flat, len = " << rep->length
           << ", cap = " << rep->flat()->Capacity();
    maybe_dump_data(rep);
  } else if (rep->tag == EXTERNAL) {
    stream << "Extn, len = " << rep->length;
    maybe_dump_data(rep);
  }
}